

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStackSwitch
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,Name tag)

{
  bool bVar1;
  size_t sVar2;
  StackSwitch *pSVar3;
  optional<wasm::HeapType> ct_00;
  StackSwitch local_c8;
  ChildPopper local_80 [4];
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  HeapType ct_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = ct.id;
  bVar1 = HeapType::isContinuation
                    ((HeapType *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  if (bVar1) {
    local_c8.operands.allocator = &this->wasm->allocator;
    local_c8.super_SpecificExpression<(wasm::Expression::Id)95>.super_Expression._id = StackSwitchId
    ;
    local_c8.super_SpecificExpression<(wasm::Expression::Id)95>.super_Expression.type.id = 0;
    local_c8.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    data = (Expression **)0x0;
    local_c8.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    local_c8.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    local_c8.tag.super_IString.str._M_len = tag.super_IString.str._M_len;
    local_c8.tag.super_IString.str._M_str = tag.super_IString.str._M_str;
    local_80[0].builder =
         (IRBuilder *)
         HeapType::getContinuation
                   ((HeapType *)
                    ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    _local_60 = (undefined1  [16])HeapType::getSignature((HeapType *)local_80);
    sVar2 = wasm::Type::size((Type *)local_60);
    if (sVar2 != 0) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                (&local_c8.operands.
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 sVar2 - 1);
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      local_80[0].builder = this;
      ChildPopper::visitStackSwitch((Result<wasm::Ok> *)local_60,local_80,&local_c8,ct_00);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)local_80,(string *)local_60);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_80);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
        anon_unknown_283::validateTypeAnnotation
                  ((Result<wasm::Ok> *)local_60,
                   (HeapType)
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,local_c8.cont);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
          pSVar3 = Builder::makeStackSwitch(&this->builder,tag,&local_c8.operands,local_c8.cont);
          push(this,(Expression *)pSVar3);
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string((string *)local_80,(string *)local_60);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_80);
      }
      std::__cxx11::string::~string((string *)local_80);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,
               "arity mismatch: the continuation argument must have, at least, unary arity",
               (allocator<char> *)local_80);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_60);
    pSVar3 = (StackSwitch *)local_60;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"expected continuation type",(allocator<char> *)local_60);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_c8);
    pSVar3 = &local_c8;
  }
  std::__cxx11::string::~string((string *)pSVar3);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStackSwitch(HeapType ct, Name tag) {
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }
  StackSwitch curr(wasm.allocator);
  curr.tag = tag;
  auto nparams = ct.getContinuation().type.getSignature().params.size();
  if (nparams < 1) {
    return Err{"arity mismatch: the continuation argument must have, at least, "
               "unary arity"};
  }

  // The continuation argument of the continuation is synthetic,
  // i.e. it is provided by the runtime.
  curr.operands.resize(nparams - 1);

  CHECK_ERR(ChildPopper{*this}.visitStackSwitch(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeStackSwitch(tag, std::move(curr.operands), curr.cont));
  return Ok{};
}